

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::combineOr(OptimizeInstructions *this,Binary *curr)

{
  Expression *pEVar1;
  Expression *pEVar2;
  Op op;
  bool bVar3;
  BinaryOp BVar4;
  Type type;
  undefined1 local_380 [32];
  _Rb_tree_node_base local_360 [10];
  undefined1 local_220 [32];
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_200;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *local_1f8;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_c0;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_88;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_78;
  long local_68;
  Const *cx;
  matched_t<wasm::Binary_*> local_58;
  Const *cy;
  Binary *by;
  Expression *y;
  Binary *bx;
  Expression *x;
  
  if (curr->op != OrInt32) {
    __assert_fail("curr->op == OrInt32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                  ,0xdef,"Expression *wasm::OptimizeInstructions::combineOr(Binary *)");
  }
  pEVar1 = curr->left;
  if ((((pEVar1->_id == BinaryId) && (pEVar2 = curr->right, pEVar2->_id == BinaryId)) &&
      (*(int *)(pEVar1 + 1) != *(int *)(pEVar2 + 1))) &&
     ((bVar3 = ExpressionAnalyzer::equal
                         ((Expression *)pEVar1[1].type.id,(Expression *)pEVar2[1].type.id), bVar3 &&
      (bVar3 = ExpressionAnalyzer::equal(*(Expression **)(pEVar1 + 2),*(Expression **)(pEVar2 + 2)),
      bVar3)))) {
    effects((EffectAnalyzer *)local_380,this,(Expression *)pEVar1[1].type.id);
    bVar3 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)local_380);
    if (bVar3) {
      EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_380);
    }
    else {
      effects((EffectAnalyzer *)local_220,this,*(Expression **)(pEVar1 + 2));
      bVar3 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)local_220);
      EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_220);
      EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_380);
      if (((!bVar3) && (*(int *)(pEVar1 + 1) == 0xf)) && (*(int *)(pEVar2 + 1) == 0x15)) {
        *(undefined4 *)(pEVar1 + 1) = 0x17;
        return pEVar1;
      }
    }
  }
  local_380._16_8_ = (_Base_ptr)0x0;
  local_88.binder = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&bx;
  local_360[0]._M_color = _S_red;
  local_360[0]._4_4_ = 0;
  local_220._0_8_ = &y;
  local_220._16_8_ = (matched_t<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_> *)0x0;
  local_380._0_8_ = &local_68;
  local_200 = &local_88;
  local_1f8 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
               *)local_380;
  cx = (Const *)this;
  bVar3 = Match::Internal::
          Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
          ::matches((Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                     *)local_220,curr->left);
  if (bVar3) {
    local_220._16_8_ = (matched_t<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_> *)0x0;
    local_200 = (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0;
    local_c0.submatchers.next.curr = &local_78;
    local_78.binder = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&by;
    local_c0.binder = (matched_t<wasm::Binary_*> *)&cy;
    local_c0.submatchers.curr.binder =
         (matched_t<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_> *)0x0;
    local_220._0_8_ = &local_58;
    local_c0.submatchers.next.next.curr =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
          *)local_220;
    bVar3 = Match::Internal::
            Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
            ::matches(&local_c0,curr->right);
    if ((((!bVar3) || (*(int *)(y + 1) != (cy->value).field_0.i32)) ||
        ((bx->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id !=
         (by->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id)) ||
       ((bVar3 = Literal::operator==((Literal *)(local_68 + 0x10),(Literal *)&local_58->op), !bVar3
        || (bVar3 = inversesOr((OptimizeInstructions *)cx,(Binary *)y), !bVar3))))
    goto LAB_00ae43f7;
    type.id = (bx->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
    op = And;
LAB_00ae44e6:
    BVar4 = Abstract::getBinary(type,op);
    (cy->value).field_0.i32 = BVar4;
    (cy->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id =
         (bx->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
    (cy->value).field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)bx;
    (cy->value).type.id = (uintptr_t)by;
    y[1].type.id = (uintptr_t)cy;
  }
  else {
LAB_00ae43f7:
    local_380._16_8_ = (_Base_ptr)0x0;
    local_360[0]._M_color = _S_red;
    local_360[0]._4_4_ = 0;
    local_220._0_8_ = &y;
    local_220._16_8_ = (matched_t<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_> *)0x0;
    local_88.binder = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&bx;
    local_380._0_8_ = &local_68;
    local_200 = &local_88;
    local_1f8 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                 *)local_380;
    bVar3 = Match::Internal::
            Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
            ::matches((Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                       *)local_220,curr->left);
    if (bVar3) {
      local_220._16_8_ = (matched_t<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_> *)0x0;
      local_200 = (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0;
      local_c0.submatchers.next.curr = &local_78;
      local_78.binder = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&by;
      local_c0.binder = (matched_t<wasm::Binary_*> *)&cy;
      local_c0.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_> *)0x0;
      local_220._0_8_ = &local_58;
      local_c0.submatchers.next.next.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
            *)local_220;
      bVar3 = Match::Internal::
              Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
              ::matches(&local_c0,curr->right);
      if (((bVar3) && (*(int *)(y + 1) == (cy->value).field_0.i32)) &&
         (((bx->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id ==
           (by->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id &&
          ((bVar3 = Literal::operator==((Literal *)(local_68 + 0x10),(Literal *)&local_58->op),
           bVar3 && (bVar3 = preserveOr((OptimizeInstructions *)cx,(Binary *)y), bVar3)))))) {
        type.id = (bx->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
        op = Or;
        goto LAB_00ae44e6;
      }
    }
    y = (Expression *)0x0;
  }
  return y;
}

Assistant:

Expression* combineOr(Binary* curr) {
    assert(curr->op == OrInt32);

    using namespace Abstract;
    using namespace Match;

    if (auto* left = curr->left->dynCast<Binary>()) {
      if (auto* right = curr->right->dynCast<Binary>()) {
        if (left->op != right->op &&
            ExpressionAnalyzer::equal(left->left, right->left) &&
            ExpressionAnalyzer::equal(left->right, right->right) &&
            !effects(left->left).hasSideEffects() &&
            !effects(left->right).hasSideEffects()) {
          switch (left->op) {
            //   (x > y) | (x == y)    ==>    x >= y
            case EqInt32: {
              if (right->op == GtSInt32) {
                left->op = GeSInt32;
                return left;
              }
              break;
            }
            default: {
            }
          }
        }
      }
    }
    {
      // Binary operations that inverses a bitwise OR to AND.
      // If F(x) = binary(x, c), and F(x) inverses OR,
      // that is,
      //
      //   F(x) | F(y) == F(x & y)
      //
      // Then also
      //
      //   binary(x, c) | binary(y, c)  =>  binary(x & y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          inversesOr(bx)) {
        by->op = getBinary(x->type, And);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    {
      // Binary operations that preserve a bitwise OR can be
      // reordered. If F(x) = binary(x, c), and F(x) preserves OR,
      // that is,
      //
      //   F(x) | F(y) == F(x | y)
      //
      // Then also
      //
      //   binary(x, c) | binary(y, c)  =>  binary(x | y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          preserveOr(bx)) {
        by->op = getBinary(x->type, Or);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    return nullptr;
  }